

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O3

void __thiscall Centaurus::CATNNode<wchar_t>::print(CATNNode<wchar_t> *this,wostream *os,int from)

{
  size_type sVar1;
  long *plVar2;
  pointer pNVar3;
  wostream *pwVar4;
  NFATransition<wchar_t> *t;
  pointer pNVar5;
  
  sVar1 = (this->m_submachine).m_id._M_string_length;
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"N",1);
  pwVar4 = (wostream *)std::wostream::operator<<((wostream *)os,from);
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar4,L" [ label=\"",10);
  if (sVar1 == 0) {
    pwVar4 = (wostream *)std::wostream::operator<<((wostream *)pwVar4,from);
  }
  else {
    pwVar4 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                       (pwVar4,(this->m_submachine).m_id._M_dataplus._M_p,
                        (this->m_submachine).m_id._M_string_length);
  }
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar4,L"\" ];",4);
  plVar2 = *(long **)(pwVar4 + *(long *)(*(long *)pwVar4 + -0x18) + 0xf0);
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 0x50))(plVar2,10);
    std::wostream::put((wchar_t)pwVar4);
    std::wostream::flush();
    pNVar5 = (this->m_transitions).
             super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pNVar3 = (this->m_transitions).
             super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    while( true ) {
      if (pNVar5 == pNVar3) {
        return;
      }
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"N",1);
      pwVar4 = (wostream *)std::wostream::operator<<((wostream *)os,from);
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar4,L" -> N",5);
      pwVar4 = (wostream *)std::wostream::operator<<((wostream *)pwVar4,pNVar5->m_dest);
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar4,L" [ label=\"",10);
      pwVar4 = (wostream *)std::wostream::operator<<((wostream *)os,pNVar5->m_tag);
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar4,L":[",2);
      pwVar4 = operator<<(pwVar4,&pNVar5->m_label);
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar4,L"]",1);
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"\" ];",4);
      plVar2 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
      if (plVar2 == (long *)0x0) break;
      (**(code **)(*plVar2 + 0x50))(plVar2,10);
      std::wostream::put((wchar_t)os);
      std::wostream::flush();
      pNVar5 = pNVar5 + 1;
    }
  }
  std::__throw_bad_cast();
}

Assistant:

void print(std::wostream& os, int from) const
	{
		if (m_submachine)
		{
			os << L"N" << from << L" [ label=\"" << m_submachine << L"\" ];" << std::endl;
		}
		else
		{
			os << L"N" << from << L" [ label=\"" << from << L"\" ];" << std::endl;
		}

		for (const auto& t : m_transitions)
		{
			os << L"N" << from << L" -> N" << t.dest() << L" [ label=\"";
			os << t.tag() << L":[" << t.label() << L"]";
			os << L"\" ];" << std::endl;
		}
	}